

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_boolean_equal_u16string_literal(void)

{
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_48,false);
  local_a[0] = trial::dynamic::operator==(&local_48,(char16_t (*) [1])0x247fba);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x185,"void equality_suite::compare_boolean_equal_u16string_literal()",local_a,
             &local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_98,false);
  local_5e[0] = trial::dynamic::operator!=(&local_98,(char16_t (*) [1])0x247fba);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x186,"void equality_suite::compare_boolean_equal_u16string_literal()",local_5e,
             &local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_d8,true);
  local_9b[0] = trial::dynamic::operator==(&local_d8,(char16_t (*) [1])0x247fba);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x187,"void equality_suite::compare_boolean_equal_u16string_literal()",local_9b,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_118,true);
  local_db[0] = trial::dynamic::operator!=(&local_118,(char16_t (*) [1])0x247fba);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x188,"void equality_suite::compare_boolean_equal_u16string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_158,false);
  local_11b[0] = trial::dynamic::operator==(&local_158,(char16_t (*) [8])L"charlie");
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x18a,"void equality_suite::compare_boolean_equal_u16string_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,false);
  local_15b[0] = trial::dynamic::operator!=(&local_198,(char16_t (*) [8])L"charlie");
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x18b,"void equality_suite::compare_boolean_equal_u16string_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1d8,true);
  local_19b[0] = trial::dynamic::operator==(&local_1d8,(char16_t (*) [8])L"charlie");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x18c,"void equality_suite::compare_boolean_equal_u16string_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_218,true);
  local_1db[0] = trial::dynamic::operator!=(&local_218,(char16_t (*) [8])L"charlie");
  local_219 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x18d,"void equality_suite::compare_boolean_equal_u16string_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  return;
}

Assistant:

void compare_boolean_equal_u16string_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) == u"", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) != u"", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) == u"", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) != u"", true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) == u"charlie", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(false) != u"charlie", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) == u"charlie", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(true) != u"charlie", true);
}